

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool showBodyOnly(TidyDocImpl *doc,TidyTriState bodyOnly)

{
  Node *pNVar1;
  Node *node;
  TidyTriState bodyOnly_local;
  TidyDocImpl *doc_local;
  
  if (bodyOnly == TidyNoState) {
    doc_local._4_4_ = no;
  }
  else if (bodyOnly == TidyYesState) {
    doc_local._4_4_ = yes;
  }
  else {
    pNVar1 = prvTidyFindBody(doc);
    if ((pNVar1 == (Node *)0x0) || (pNVar1->implicit == no)) {
      doc_local._4_4_ = no;
    }
    else {
      doc_local._4_4_ = yes;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static
Bool showBodyOnly( TidyDocImpl* doc, TidyTriState bodyOnly )
{
    Node* node;

    switch( bodyOnly )
    {
    case TidyNoState:
        return no;
    case TidyYesState:
        return yes;
    default:
        node = TY_(FindBody)( doc );
        if (node && node->implicit )
            return yes;
    }
    return no;
}